

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O0

void opus_tags_clear(OpusTags *_tags)

{
  int local_18;
  int local_14;
  int ci;
  int ncomments;
  OpusTags *_tags_local;
  
  local_14 = _tags->comments;
  if (_tags->user_comments != (char **)0x0) {
    local_14 = local_14 + 1;
  }
  local_18 = local_14;
  while (0 < local_18) {
    free(_tags->user_comments[local_18 + -1]);
    local_18 = local_18 + -1;
  }
  free(_tags->user_comments);
  free(_tags->comment_lengths);
  free(_tags->vendor);
  return;
}

Assistant:

void opus_tags_clear(OpusTags *_tags){
  int ncomments;
  int ci;
  ncomments=_tags->comments;
  if(_tags->user_comments!=NULL)ncomments++;
  else{
    OP_ASSERT(ncomments==0);
  }
  for(ci=ncomments;ci-->0;)_ogg_free(_tags->user_comments[ci]);
  _ogg_free(_tags->user_comments);
  _ogg_free(_tags->comment_lengths);
  _ogg_free(_tags->vendor);
}